

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O0

Data2D<int> *
TasGrid::HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)1>
          (Data2D<int> *__return_storage_ptr__,MultiIndexSet *mset,bool *is_complete)

{
  value_type vVar1;
  bool bVar2;
  pointer piVar3;
  int new_num_strips;
  int iVar4;
  int iVar5;
  size_t __n;
  int *piVar6;
  reference pvVar7;
  int *p_00;
  bool bVar8;
  size_type local_d8;
  size_t j_1;
  int *pp_1;
  undefined1 local_c0 [8];
  vector<int,_std::allocator<int>_> dad_1;
  int *p_1;
  int i_1;
  int fail_1;
  int any_fail_1;
  size_type sStack_88;
  int current;
  size_t j;
  int *pp;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> dad;
  int *p;
  int i;
  int fail;
  int any_fail;
  int level0_offset;
  int max_parents;
  int num_points;
  size_t num_dimensions;
  bool *is_complete_local;
  MultiIndexSet *mset_local;
  Data2D<int> *parents;
  
  __n = MultiIndexSet::getNumDimensions(mset);
  new_num_strips = MultiIndexSet::getNumIndexes(mset);
  iVar4 = RuleLocal::getMaxNumParents<(TasGrid::RuleLocal::erule)1>();
  max_parents = (int)__n;
  if (iVar4 < 2) {
    Data2D<int>::Data2D<int,int>(__return_storage_ptr__,max_parents,new_num_strips);
    bVar2 = false;
    for (p_1._4_4_ = 0; p_1._4_4_ < new_num_strips; p_1._4_4_ = p_1._4_4_ + 1) {
      dad_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = MultiIndexSet::getIndex(mset,p_1._4_4_);
      ::std::allocator<int>::allocator((allocator<int> *)((long)&pp_1 + 7));
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_c0,__n,
                 (allocator<int> *)((long)&pp_1 + 7));
      ::std::allocator<int>::~allocator((allocator<int> *)((long)&pp_1 + 7));
      piVar3 = dad_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      piVar6 = ::std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)local_c0);
      ::std::copy_n<int_const*,unsigned_long,int*>(piVar3,__n,piVar6);
      piVar6 = Data2D<int>::getStrip(__return_storage_ptr__,p_1._4_4_);
      for (local_d8 = 0; local_d8 < __n; local_d8 = local_d8 + 1) {
        pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_c0,local_d8);
        if (*pvVar7 == 0) {
          piVar6[local_d8] = -1;
        }
        else {
          pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_c0,local_d8);
          iVar4 = RuleLocal::getParent<(TasGrid::RuleLocal::erule)1>(*pvVar7);
          pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_c0,local_d8);
          *pvVar7 = iVar4;
          p_00 = ::std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)local_c0);
          iVar4 = MultiIndexSet::getSlot(mset,p_00);
          piVar6[local_d8] = iVar4;
          if (piVar6[local_d8] == -1) {
            bVar2 = true;
          }
          while( true ) {
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_c0,local_d8);
            bVar8 = false;
            if (*pvVar7 != 0) {
              bVar8 = piVar6[local_d8] == -1;
            }
            if (!bVar8) break;
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_c0,local_d8);
            iVar4 = RuleLocal::getParent<(TasGrid::RuleLocal::erule)1>(*pvVar7);
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_c0,local_d8);
            *pvVar7 = iVar4;
            iVar4 = MultiIndexSet::getSlot(mset,(vector<int,_std::allocator<int>_> *)local_c0);
            piVar6[local_d8] = iVar4;
          }
          vVar1 = dad_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[local_d8];
          pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_c0,local_d8);
          *pvVar7 = vVar1;
        }
      }
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_c0);
    }
    *is_complete = !bVar2;
  }
  else {
    iVar4 = RuleLocal::getMaxNumParents<(TasGrid::RuleLocal::erule)1>();
    Data2D<int>::Data2D<int,int>(__return_storage_ptr__,iVar4 * max_parents,new_num_strips,-1);
    iVar4 = RuleLocal::getNumPoints<(TasGrid::RuleLocal::erule)1>(0);
    bVar2 = false;
    for (p._0_4_ = 0; (int)p < new_num_strips; p._0_4_ = (int)p + 1) {
      dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = MultiIndexSet::getIndex(mset,(int)p);
      ::std::allocator<int>::allocator((allocator<int> *)((long)&pp + 7));
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_70,__n,(allocator<int> *)((long)&pp + 7)
                );
      ::std::allocator<int>::~allocator((allocator<int> *)((long)&pp + 7));
      piVar3 = dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      piVar6 = ::std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)local_70);
      ::std::copy_n<int_const*,unsigned_long,int*>(piVar3,__n,piVar6);
      piVar6 = Data2D<int>::getStrip(__return_storage_ptr__,(int)p);
      for (sStack_88 = 0; sStack_88 < __n; sStack_88 = sStack_88 + 1) {
        pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_70,sStack_88);
        if (iVar4 <= *pvVar7) {
          any_fail_1 = dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage[sStack_88];
          iVar5 = RuleLocal::getParent<(TasGrid::RuleLocal::erule)1>(any_fail_1);
          pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_70,sStack_88);
          *pvVar7 = iVar5;
          iVar5 = MultiIndexSet::getSlot(mset,(vector<int,_std::allocator<int>_> *)local_70);
          piVar6[sStack_88 * 2] = iVar5;
          if (piVar6[sStack_88 * 2] == -1) {
            bVar2 = true;
          }
          while( true ) {
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_70,sStack_88);
            bVar8 = false;
            if (iVar4 <= *pvVar7) {
              bVar8 = piVar6[sStack_88 * 2] == -1;
            }
            if (!bVar8) break;
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_70,sStack_88);
            any_fail_1 = *pvVar7;
            iVar5 = RuleLocal::getParent<(TasGrid::RuleLocal::erule)1>(any_fail_1);
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_70,sStack_88);
            *pvVar7 = iVar5;
            iVar5 = MultiIndexSet::getSlot(mset,(vector<int,_std::allocator<int>_> *)local_70);
            piVar6[sStack_88 * 2] = iVar5;
          }
          iVar5 = RuleLocal::getStepParent<(TasGrid::RuleLocal::erule)1>(any_fail_1);
          pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_70,sStack_88);
          *pvVar7 = iVar5;
          pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_70,sStack_88);
          if (*pvVar7 != -1) {
            iVar5 = MultiIndexSet::getSlot(mset,(vector<int,_std::allocator<int>_> *)local_70);
            piVar6[sStack_88 * 2 + 1] = iVar5;
            if (piVar6[sStack_88 * 2 + 1] == -1) {
              bVar2 = true;
            }
          }
          vVar1 = dad.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage[sStack_88];
          pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_70,sStack_88);
          *pvVar7 = vVar1;
        }
      }
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_70);
    }
    *is_complete = !bVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> computeDAGup(MultiIndexSet const &mset, bool &is_complete){
    size_t num_dimensions = mset.getNumDimensions();
    int num_points = mset.getNumIndexes();
    if (RuleLocal::getMaxNumParents<effrule>() > 1){ // allow for multiple parents and level 0 may have more than one node
        int max_parents = RuleLocal::getMaxNumParents<effrule>() * (int) num_dimensions;
        Data2D<int> parents(max_parents, num_points, -1);
        int level0_offset = RuleLocal::getNumPoints<effrule>(0);
        int any_fail = 0; // count if there are failures
        #pragma omp parallel
        {
            int fail = 0; // local thread count fails

            #pragma omp for schedule(static)
            for(int i=0; i<num_points; i++){
                const int *p = mset.getIndex(i);
                std::vector<int> dad(num_dimensions);
                std::copy_n(p, num_dimensions, dad.data());
                int *pp = parents.getStrip(i);
                for(size_t j=0; j<num_dimensions; j++){
                    if (dad[j] >= level0_offset){
                        int current = p[j];
                        dad[j] = RuleLocal::getParent<effrule>(current);
                        pp[2*j] = mset.getSlot(dad);
                        if (pp[2*j] == -1)
                            fail = 1;
                        while ((dad[j] >= level0_offset) && (pp[2*j] == -1)){
                            current = dad[j];
                            dad[j] = RuleLocal::getParent<effrule>(current);
                            pp[2*j] = mset.getSlot(dad);
                        }
                        dad[j] = RuleLocal::getStepParent<effrule>(current);
                        if (dad[j] != -1){
                            pp[2*j + 1] = mset.getSlot(dad);
                            if (pp[2*j + 1] == -1)
                                fail = 1;
                        }
                        dad[j] = p[j];
                    }
                }
            }

            #pragma omp atomic
            any_fail += fail;
        }
        is_complete = (any_fail == 0);
        return parents;
    }else{ // this assumes that level zero has only one node
        Data2D<int> parents((int) num_dimensions, num_points);
        int any_fail = 0; // count if there are failures
        #pragma omp parallel
        {
            int fail = 0; // local thread count fails

            #pragma omp for schedule(static)
            for(int i=0; i<num_points; i++){
                const int *p = mset.getIndex(i);
                std::vector<int> dad(num_dimensions);
                std::copy_n(p, num_dimensions, dad.data());
                int *pp = parents.getStrip(i);
                for(size_t j=0; j<num_dimensions; j++){
                    if (dad[j] == 0){
                        pp[j] = -1;
                    }else{
                        dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                        pp[j] = mset.getSlot(dad.data());
                        if (pp[j] == -1)
                            fail = 1;
                        while((dad[j] != 0) && (pp[j] == -1)){
                            dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                            pp[j] = mset.getSlot(dad);
                        }
                        dad[j] = p[j];
                    }
                }
            }

            #pragma omp atomic
            any_fail += fail;
        }
        is_complete = (any_fail == 0);
        return parents;
    }
}